

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::genWriteInterleavedProgram
          (InterCallTestCase *this,int seed,bool evenOdd)

{
  Context *this_00;
  ostream *poVar1;
  ShaderProgram *this_01;
  RenderContext *renderCtx;
  Context *context;
  ProgramSources *sources;
  InterCallTestCase *pIVar2;
  undefined7 uVar3;
  char *pcVar4;
  char *local_350;
  bool local_2e2;
  string local_2e0 [32];
  string local_2c0;
  ShaderSource local_2a0;
  ProgramSources local_278;
  int local_1a4;
  int local_1a0;
  int writeNdx_1;
  int writeNdx;
  ostringstream local_190 [8];
  ostringstream buf;
  bool useImageAtomics;
  bool evenOdd_local;
  int seed_local;
  InterCallTestCase *this_local;
  
  local_2e2 = false;
  if ((this->m_useAtomic & 1U) != 0) {
    local_2e2 = this->m_storage == STORAGE_IMAGE;
  }
  pIVar2 = this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"${GLSL_VERSION_DECL}\n");
  pIVar2 = (InterCallTestCase *)CONCAT71((int7)((ulong)pIVar2 >> 8),local_2e2);
  pcVar4 = "";
  if (local_2e2 != false) {
    pcVar4 = "${SHADER_IMAGE_ATOMIC_REQUIRE}\n";
  }
  poVar1 = std::operator<<(poVar1,pcVar4);
  std::operator<<(poVar1,"layout (local_size_x = 1, local_size_y = 1) in;\n");
  if (this->m_storage == STORAGE_BUFFER) {
    poVar1 = std::operator<<((ostream *)local_190,"layout(binding=0, std430) ");
    uVar3 = (undefined7)((ulong)pIVar2 >> 8);
    pcVar4 = "";
    if ((this->m_useAtomic & 1U) != 0) {
      pcVar4 = "coherent ";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    poVar1 = std::operator<<(poVar1,"buffer Buffer\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\thighp ");
    pIVar2 = (InterCallTestCase *)CONCAT71(uVar3,this->m_formatInteger);
    pcVar4 = "float";
    if ((this->m_formatInteger & 1U) != 0) {
      pcVar4 = "int";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    poVar1 = std::operator<<(poVar1," values[];\n");
    std::operator<<(poVar1,"} sb_out;\n");
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    poVar1 = std::operator<<((ostream *)local_190,"layout(");
    if ((this->m_formatInteger & 1U) == 0) {
      local_350 = "r32f";
    }
    else {
      local_350 = "r32i";
    }
    poVar1 = std::operator<<(poVar1,local_350);
    poVar1 = std::operator<<(poVar1,", binding=0) ");
    uVar3 = (undefined7)((ulong)pIVar2 >> 8);
    pcVar4 = "writeonly ";
    if ((this->m_useAtomic & 1U) != 0) {
      pcVar4 = "coherent ";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    poVar1 = std::operator<<(poVar1,"uniform highp ");
    pIVar2 = (InterCallTestCase *)CONCAT71(uVar3,this->m_formatInteger);
    pcVar4 = "image2D";
    if ((this->m_formatInteger & 1U) != 0) {
      pcVar4 = "iimage2D";
    }
    poVar1 = std::operator<<(poVar1,pcVar4);
    std::operator<<(poVar1," u_imageOut;\n");
  }
  poVar1 = std::operator<<((ostream *)local_190,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tuvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar1 = std::operator<<(poVar1,
                           "\tint groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
                          );
  std::operator<<(poVar1,"\n");
  if (this->m_storage == STORAGE_BUFFER) {
    for (local_1a0 = 0; pIVar2 = this, local_1a0 < this->m_perInvocationSize;
        local_1a0 = local_1a0 + 1) {
      if ((this->m_useAtomic & 1U) == 0) {
        std::operator<<((ostream *)local_190,"\t");
      }
      else {
        std::operator<<((ostream *)local_190,"\tatomicExchange(");
      }
      poVar1 = std::operator<<((ostream *)local_190,"sb_out.values[((groupNdx + ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,seed + (local_1a0 * this->m_invocationGridSize *
                                        this->m_invocationGridSize) / 2);
      poVar1 = std::operator<<(poVar1,") % ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,((this->m_invocationGridSize * this->m_invocationGridSize) / 2) *
                                 this->m_perInvocationSize);
      poVar1 = std::operator<<(poVar1,") * 2 + ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(byte)~evenOdd & 1);
      std::operator<<(poVar1,"]");
      if ((this->m_useAtomic & 1U) == 0) {
        poVar1 = std::operator<<((ostream *)local_190,"= ");
        pcVar4 = "float";
        if ((this->m_formatInteger & 1U) != 0) {
          pcVar4 = "int";
        }
        poVar1 = std::operator<<(poVar1,pcVar4);
        std::operator<<(poVar1,"(groupNdx);\n");
      }
      else {
        poVar1 = std::operator<<((ostream *)local_190,", ");
        pcVar4 = "float";
        if ((this->m_formatInteger & 1U) != 0) {
          pcVar4 = "int";
        }
        poVar1 = std::operator<<(poVar1,pcVar4);
        std::operator<<(poVar1,"(groupNdx));\n");
      }
    }
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    for (local_1a4 = 0; pIVar2 = this, local_1a4 < this->m_perInvocationSize;
        local_1a4 = local_1a4 + 1) {
      if ((this->m_useAtomic & 1U) == 0) {
        std::operator<<((ostream *)local_190,"\timageStore");
      }
      else {
        std::operator<<((ostream *)local_190,"\timageAtomicExchange");
      }
      poVar1 = std::operator<<((ostream *)local_190,
                               "(u_imageOut, ivec2(((int(gl_GlobalInvocationID.x) + ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,seed + local_1a4 * 100);
      poVar1 = std::operator<<(poVar1,") % ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_invocationGridSize / 2);
      poVar1 = std::operator<<(poVar1,") * 2 + ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(byte)~evenOdd & 1);
      poVar1 = std::operator<<(poVar1,", int(gl_GlobalInvocationID.y) + ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1a4 * this->m_invocationGridSize);
      std::operator<<(poVar1,"), ");
      if ((this->m_useAtomic & 1U) == 0) {
        pcVar4 = "vec4(float(groupNdx), 0.0, 0.0, 0.0)";
        if ((this->m_formatInteger & 1U) != 0) {
          pcVar4 = "ivec4(int(groupNdx), 0, 0, 0)";
        }
        poVar1 = std::operator<<((ostream *)local_190,pcVar4);
        std::operator<<(poVar1,");\n");
      }
      else {
        pcVar4 = "float";
        if ((this->m_formatInteger & 1U) != 0) {
          pcVar4 = "int";
        }
        poVar1 = std::operator<<((ostream *)local_190,pcVar4);
        std::operator<<(poVar1,"(groupNdx));\n");
      }
    }
  }
  std::operator<<((ostream *)local_190,"}\n");
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_278);
  this_00 = (this->super_TestCase).m_context;
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2c0,(_anonymous_namespace_ *)this_00,context,(char *)pIVar2);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2a0,&local_2c0);
  sources = glu::ProgramSources::operator<<(&local_278,&local_2a0);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string(local_2e0);
  glu::ProgramSources::~ProgramSources(&local_278);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return this_01;
}

Assistant:

glu::ShaderProgram* InterCallTestCase::genWriteInterleavedProgram (int seed, bool evenOdd)
{
	const bool			useImageAtomics = m_useAtomic && m_storage == STORAGE_IMAGE;
	std::ostringstream	buf;

	buf << "${GLSL_VERSION_DECL}\n"
		<< ((useImageAtomics) ? ("${SHADER_IMAGE_ATOMIC_REQUIRE}\n") : (""))
		<< "layout (local_size_x = 1, local_size_y = 1) in;\n";

	if (m_storage == STORAGE_BUFFER)
		buf << "layout(binding=0, std430) " << ((m_useAtomic) ? ("coherent ") : ("")) << "buffer Buffer\n"
			<< "{\n"
			<< "	highp " << ((m_formatInteger) ? ("int") : ("float")) << " values[];\n"
			<< "} sb_out;\n";
	else if (m_storage == STORAGE_IMAGE)
		buf << "layout(" << ((m_formatInteger) ? ("r32i") : ("r32f")) << ", binding=0) " << ((m_useAtomic) ? ("coherent ") : ("writeonly ")) << "uniform highp " << ((m_formatInteger) ? ("iimage2D") : ("image2D")) << " u_imageOut;\n";
	else
		DE_ASSERT(DE_FALSE);

	buf << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uvec3 size    = gl_NumWorkGroups * gl_WorkGroupSize;\n"
		<< "	int groupNdx  = int(size.x * size.y * gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x);\n"
		<< "\n";

	// Write to buffer/image m_perInvocationSize elements
	if (m_storage == STORAGE_BUFFER)
	{
		for (int writeNdx = 0; writeNdx < m_perInvocationSize; ++writeNdx)
		{
			if (m_useAtomic)
				buf << "	atomicExchange(";
			else
				buf << "	";

			buf << "sb_out.values[((groupNdx + " << seed + writeNdx*m_invocationGridSize*m_invocationGridSize / 2 << ") % " << m_invocationGridSize*m_invocationGridSize / 2 * m_perInvocationSize  << ") * 2 + " << ((evenOdd) ? (0) : (1)) << "]";

			if (m_useAtomic)
				buf << ", " << ((m_formatInteger) ? ("int") : ("float")) << "(groupNdx));\n";
			else
				buf << "= " << ((m_formatInteger) ? ("int") : ("float")) << "(groupNdx);\n";
		}
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		for (int writeNdx = 0; writeNdx < m_perInvocationSize; ++writeNdx)
		{
			if (m_useAtomic)
				buf << "	imageAtomicExchange";
			else
				buf << "	imageStore";

			buf << "(u_imageOut, ivec2(((int(gl_GlobalInvocationID.x) + " << (seed + writeNdx*100) << ") % " << m_invocationGridSize / 2 << ") * 2 + " << ((evenOdd) ? (0) : (1)) << ", int(gl_GlobalInvocationID.y) + " << writeNdx*m_invocationGridSize << "), ";

			if (m_useAtomic)
				buf << ((m_formatInteger) ? ("int") : ("float")) << "(groupNdx));\n";
			else
				buf << ((m_formatInteger) ? ("ivec4(int(groupNdx), 0, 0, 0)") : ("vec4(float(groupNdx), 0.0, 0.0, 0.0)")) << ");\n";
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	buf << "}\n";

	return new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, buf.str().c_str())));
}